

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O2

void __thiscall btMultiBodyDynamicsWorld::debugDrawWorld(btMultiBodyDynamicsWorld *this)

{
  btMultiBody *this_00;
  btMultibodyLink *pbVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  int m;
  btVector3 *pbVar4;
  long lVar5;
  int c;
  long lVar6;
  btTransform *this_01;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  btVector3 bVar7;
  CProfileSample __profile_1;
  CProfileSample __profile;
  btVector3 to;
  btVector3 from;
  btAlignedObjectArray<btVector3> local_origin1;
  btAlignedObjectArray<btQuaternion> world_to_local1;
  btVector3 vec;
  CProfileSample local_13a;
  CProfileSample local_139;
  btQuadWord local_138;
  btMultiBodyDynamicsWorld *local_120;
  btQuadWord local_118;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  btQuadWord local_e8;
  btVector3 local_d8;
  undefined1 local_c8 [16];
  long local_b8;
  btAlignedObjectArray<btVector3> local_b0;
  btAlignedObjectArray<btQuaternion> local_90;
  btTransform local_70;
  
  CProfileManager::Start_Profile("btMultiBodyDynamicsWorld debugDrawWorld");
  iVar2 = (*(this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.super_btCollisionWorld.
            _vptr_btCollisionWorld[5])(this);
  if (CONCAT44(extraout_var,iVar2) != 0) {
    iVar2 = (*(this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.super_btCollisionWorld.
              _vptr_btCollisionWorld[5])(this);
    uVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x70))
                      ((long *)CONCAT44(extraout_var_00,iVar2));
    if ((uVar3 & 0x1800) != 0) {
      CProfileManager::Start_Profile("btMultiBody debugDrawWorld");
      local_90.m_ownsMemory = true;
      local_90.m_data = (btQuaternion *)0x0;
      local_90.m_size = 0;
      local_90.m_capacity = 0;
      local_b0.m_ownsMemory = true;
      local_b0.m_data = (btVector3 *)0x0;
      local_b0.m_size = 0;
      local_b0.m_capacity = 0;
      for (lVar6 = 0; lVar6 < (this->m_multiBodyConstraints).m_size; lVar6 = lVar6 + 1) {
        (*(this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.super_btCollisionWorld.
          _vptr_btCollisionWorld[0x37])(this,(this->m_multiBodyConstraints).m_data[lVar6]);
      }
      lVar6 = 0;
      local_120 = this;
      while (this = local_120, lVar6 < (local_120->m_multiBodies).m_size) {
        this_00 = (local_120->m_multiBodies).m_data[lVar6];
        btMultiBody::forwardKinematics(this_00,&local_90,&local_b0);
        iVar2 = (*(this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.super_btCollisionWorld
                  ._vptr_btCollisionWorld[5])(this);
        local_b8 = lVar6;
        btMultiBody::getBaseWorldTransform(&local_70,this_00);
        (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x80))
                  (0x3dcccccd,(long *)CONCAT44(extraout_var_01,iVar2),&local_70);
        lVar5 = 0;
        for (lVar6 = 0; lVar6 < (this_00->m_links).m_size; lVar6 = lVar6 + 1) {
          pbVar1 = (this_00->m_links).m_data;
          iVar2 = (*(local_120->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.
                    super_btCollisionWorld._vptr_btCollisionWorld[5])();
          this_01 = (btTransform *)
                    ((long)(pbVar1->m_cachedWorldTransform).m_basis.m_el[0].m_floats + lVar5);
          (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 0x80))
                    (0x3dcccccd,(long *)CONCAT44(extraout_var_02,iVar2),this_01);
          iVar2 = *(int *)((long)(((this_00->m_links).m_data)->m_cachedWorldTransform).m_basis.m_el
                                 [0].m_floats + lVar5 + -0xc);
          if (iVar2 == 0) {
            local_138.m_floats = (btScalar  [4])btTransform::getRotation(this_01);
            local_70.m_basis.m_el[0] =
                 quatRotate((btQuaternion *)&local_138,
                            (btVector3 *)
                            ((long)((this_00->m_links).m_data)->m_axes[0].m_topVec.m_floats + lVar5)
                           );
            local_138.m_floats = (btScalar  [4])(ZEXT816(0x3f80000000000000) << 0x40);
            pbVar4 = (btVector3 *)((long)(pbVar1->m_cachedWorldTransform).m_origin.m_floats + lVar5)
            ;
            bVar7 = operator+((btVector3 *)&local_70,pbVar4);
            local_f8._8_4_ = extraout_XMM0_Dc;
            local_f8._0_8_ = bVar7.m_floats._0_8_;
            local_f8._12_4_ = extraout_XMM0_Dd;
            local_108._8_4_ = in_XMM1_Dc;
            local_108._0_8_ = bVar7.m_floats._8_8_;
            local_108._12_4_ = in_XMM1_Dd;
            local_118.m_floats = (btScalar  [4])btTransform::getRotation(this_01);
            bVar7 = quatRotate((btQuaternion *)&local_118,
                               (btVector3 *)
                               ((long)(((this_00->m_links).m_data)->m_dVector).m_floats + lVar5));
            local_c8._4_4_ = (float)local_f8._4_4_ - bVar7.m_floats[1];
            local_c8._0_4_ = (float)local_f8._0_4_ - bVar7.m_floats[0];
            local_c8._8_4_ = (float)local_108._0_4_ - bVar7.m_floats[2];
            local_c8._12_4_ = 0;
            local_e8.m_floats = (btScalar  [4])btTransform::getRotation(this_01);
            local_d8 = quatRotate((btQuaternion *)&local_e8,
                                  (btVector3 *)
                                  ((long)(((this_00->m_links).m_data)->m_dVector).m_floats + lVar5))
            ;
            local_118.m_floats = (btScalar  [4])operator-(pbVar4,&local_d8);
            iVar2 = (*(local_120->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.
                      super_btCollisionWorld._vptr_btCollisionWorld[5])();
            (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar2) + 0x20))
                      ((long *)CONCAT44(extraout_var_03,iVar2),local_c8,&local_118,&local_138);
            iVar2 = *(int *)((long)(((this_00->m_links).m_data)->m_cachedWorldTransform).m_basis.
                                   m_el[0].m_floats + lVar5 + -0xc);
          }
          if (iVar2 == 4) {
            local_138.m_floats = (btScalar  [4])btTransform::getRotation(this_01);
            local_70.m_basis.m_el[0] =
                 quatRotate((btQuaternion *)&local_138,
                            (btVector3 *)
                            ((long)((this_00->m_links).m_data)->m_axes[0].m_bottomVec.m_floats +
                            lVar5));
            local_138.m_floats = (btScalar  [4])(ZEXT816(0x3f80000000000000) << 0x40);
            pbVar4 = (btVector3 *)((long)(pbVar1->m_cachedWorldTransform).m_origin.m_floats + lVar5)
            ;
            bVar7 = operator+((btVector3 *)&local_70,pbVar4);
            local_f8._8_4_ = extraout_XMM0_Dc_00;
            local_f8._0_8_ = bVar7.m_floats._0_8_;
            local_f8._12_4_ = extraout_XMM0_Dd_00;
            local_108._8_4_ = in_XMM1_Dc;
            local_108._0_8_ = bVar7.m_floats._8_8_;
            local_108._12_4_ = in_XMM1_Dd;
            local_118.m_floats = (btScalar  [4])btTransform::getRotation(this_01);
            bVar7 = quatRotate((btQuaternion *)&local_118,
                               (btVector3 *)
                               ((long)(((this_00->m_links).m_data)->m_dVector).m_floats + lVar5));
            local_c8._4_4_ = (float)local_f8._4_4_ - bVar7.m_floats[1];
            local_c8._0_4_ = (float)local_f8._0_4_ - bVar7.m_floats[0];
            local_c8._8_4_ = (float)local_108._0_4_ - bVar7.m_floats[2];
            local_c8._12_4_ = 0;
            local_e8.m_floats = (btScalar  [4])btTransform::getRotation(this_01);
            local_d8 = quatRotate((btQuaternion *)&local_e8,
                                  (btVector3 *)
                                  ((long)(((this_00->m_links).m_data)->m_dVector).m_floats + lVar5))
            ;
            local_118.m_floats = (btScalar  [4])operator-(pbVar4,&local_d8);
            iVar2 = (*(local_120->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.
                      super_btCollisionWorld._vptr_btCollisionWorld[5])();
            (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar2) + 0x20))
                      ((long *)CONCAT44(extraout_var_04,iVar2),local_c8,&local_118,&local_138);
            iVar2 = *(int *)((long)(((this_00->m_links).m_data)->m_cachedWorldTransform).m_basis.
                                   m_el[0].m_floats + lVar5 + -0xc);
          }
          if (iVar2 == 1) {
            local_138.m_floats = (btScalar  [4])btTransform::getRotation(this_01);
            local_70.m_basis.m_el[0] =
                 quatRotate((btQuaternion *)&local_138,
                            (btVector3 *)
                            ((long)((this_00->m_links).m_data)->m_axes[0].m_bottomVec.m_floats +
                            lVar5));
            local_138.m_floats = (btScalar  [4])(ZEXT816(0x3f80000000000000) << 0x40);
            pbVar4 = (btVector3 *)((long)(pbVar1->m_cachedWorldTransform).m_origin.m_floats + lVar5)
            ;
            bVar7 = operator+((btVector3 *)&local_70,pbVar4);
            local_f8._8_4_ = extraout_XMM0_Dc_01;
            local_f8._0_8_ = bVar7.m_floats._0_8_;
            local_f8._12_4_ = extraout_XMM0_Dd_01;
            local_108._8_4_ = in_XMM1_Dc;
            local_108._0_8_ = bVar7.m_floats._8_8_;
            local_108._12_4_ = in_XMM1_Dd;
            local_118.m_floats = (btScalar  [4])btTransform::getRotation(this_01);
            bVar7 = quatRotate((btQuaternion *)&local_118,
                               (btVector3 *)
                               ((long)(((this_00->m_links).m_data)->m_dVector).m_floats + lVar5));
            local_c8._4_4_ = (float)local_f8._4_4_ - bVar7.m_floats[1];
            local_c8._0_4_ = (float)local_f8._0_4_ - bVar7.m_floats[0];
            local_c8._8_4_ = (float)local_108._0_4_ - bVar7.m_floats[2];
            local_c8._12_4_ = 0;
            local_e8.m_floats = (btScalar  [4])btTransform::getRotation(this_01);
            local_d8 = quatRotate((btQuaternion *)&local_e8,
                                  (btVector3 *)
                                  ((long)(((this_00->m_links).m_data)->m_dVector).m_floats + lVar5))
            ;
            local_118.m_floats = (btScalar  [4])operator-(pbVar4,&local_d8);
            iVar2 = (*(local_120->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.
                      super_btCollisionWorld._vptr_btCollisionWorld[5])();
            (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar2) + 0x20))
                      ((long *)CONCAT44(extraout_var_05,iVar2),local_c8,&local_118,&local_138);
          }
          lVar5 = lVar5 + 600;
        }
        lVar6 = local_b8 + 1;
      }
      btAlignedObjectArray<btVector3>::~btAlignedObjectArray(&local_b0);
      btAlignedObjectArray<btQuaternion>::~btAlignedObjectArray(&local_90);
      CProfileSample::~CProfileSample(&local_13a);
    }
  }
  btDiscreteDynamicsWorld::debugDrawWorld(&this->super_btDiscreteDynamicsWorld);
  CProfileSample::~CProfileSample(&local_139);
  return;
}

Assistant:

void	btMultiBodyDynamicsWorld::debugDrawWorld()
{
	BT_PROFILE("btMultiBodyDynamicsWorld debugDrawWorld");

	bool drawConstraints = false;
	if (getDebugDrawer())
	{
		int mode = getDebugDrawer()->getDebugMode();
		if (mode  & (btIDebugDraw::DBG_DrawConstraints | btIDebugDraw::DBG_DrawConstraintLimits))
		{
			drawConstraints = true;
		}

		if (drawConstraints)
		{
			BT_PROFILE("btMultiBody debugDrawWorld");
			
			btAlignedObjectArray<btQuaternion> world_to_local1;
			btAlignedObjectArray<btVector3> local_origin1;

			for (int c=0;c<m_multiBodyConstraints.size();c++)
			{
				btMultiBodyConstraint* constraint = m_multiBodyConstraints[c];
				debugDrawMultiBodyConstraint(constraint);
			}

			for (int b = 0; b<m_multiBodies.size(); b++)
			{
				btMultiBody* bod = m_multiBodies[b];
				bod->forwardKinematics(world_to_local1,local_origin1);
				
				getDebugDrawer()->drawTransform(bod->getBaseWorldTransform(), 0.1);


				for (int m = 0; m<bod->getNumLinks(); m++)
				{
					
					const btTransform& tr = bod->getLink(m).m_cachedWorldTransform;

					getDebugDrawer()->drawTransform(tr, 0.1);

						//draw the joint axis
					if (bod->getLink(m).m_jointType==btMultibodyLink::eRevolute)
					{
						btVector3 vec = quatRotate(tr.getRotation(),bod->getLink(m).m_axes[0].m_topVec);
					
						btVector4 color(0,0,0,1);//1,1,1);
						btVector3 from = vec+tr.getOrigin()-quatRotate(tr.getRotation(),bod->getLink(m).m_dVector);
						btVector3 to = tr.getOrigin()-quatRotate(tr.getRotation(),bod->getLink(m).m_dVector);
						getDebugDrawer()->drawLine(from,to,color);
					}
					if (bod->getLink(m).m_jointType==btMultibodyLink::eFixed)
					{
						btVector3 vec = quatRotate(tr.getRotation(),bod->getLink(m).m_axes[0].m_bottomVec);
					
						btVector4 color(0,0,0,1);//1,1,1);
						btVector3 from = vec+tr.getOrigin()-quatRotate(tr.getRotation(),bod->getLink(m).m_dVector);
						btVector3 to = tr.getOrigin()-quatRotate(tr.getRotation(),bod->getLink(m).m_dVector);
						getDebugDrawer()->drawLine(from,to,color);
					}
					if (bod->getLink(m).m_jointType==btMultibodyLink::ePrismatic)
					{
						btVector3 vec = quatRotate(tr.getRotation(),bod->getLink(m).m_axes[0].m_bottomVec);
					
						btVector4 color(0,0,0,1);//1,1,1);
						btVector3 from = vec+tr.getOrigin()-quatRotate(tr.getRotation(),bod->getLink(m).m_dVector);
						btVector3 to = tr.getOrigin()-quatRotate(tr.getRotation(),bod->getLink(m).m_dVector);
						getDebugDrawer()->drawLine(from,to,color);
					}
					
				}
			}
		}
	}

	btDiscreteDynamicsWorld::debugDrawWorld();
}